

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

SQInteger class_newmember(HSQUIRRELVM v)

{
  int iVar1;
  HSQUIRRELVM v_00;
  SQRESULT SVar2;
  HSQUIRRELVM in_RDI;
  SQBool bstatic;
  SQInteger top;
  SQBool in_stack_00000018;
  SQInteger in_stack_00000020;
  HSQUIRRELVM in_stack_00000028;
  SQInteger nelemstopop;
  
  v_00 = (HSQUIRRELVM)sq_gettop(in_RDI);
  nelemstopop = 0;
  if (v_00 == (HSQUIRRELVM)0x5) {
    sq_tobool((HSQUIRRELVM)bstatic,(SQInteger)in_RDI,(SQBool *)0x5);
    sq_pop(v_00,nelemstopop);
  }
  if ((long)v_00 < 4) {
    sq_pushnull((HSQUIRRELVM)0x149c0d);
  }
  SVar2 = sq_newmember(in_stack_00000028,in_stack_00000020,in_stack_00000018);
  iVar1 = -1;
  if (-1 < SVar2) {
    iVar1 = 1;
  }
  return (long)iVar1;
}

Assistant:

static SQInteger class_newmember(HSQUIRRELVM v)
{
    SQInteger top = sq_gettop(v);
    SQBool bstatic = SQFalse;
    if(top == 5)
    {
        sq_tobool(v,-1,&bstatic);
        sq_pop(v,1);
    }

    if(top < 4) {
        sq_pushnull(v);
    }
    return SQ_SUCCEEDED(sq_newmember(v,-4,bstatic))?1:SQ_ERROR;
}